

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O0

Value __thiscall duckdb_tdigest::TDigest::quantile(TDigest *this,Value q)

{
  bool bVar1;
  TDigest *in_XMM0_Qa;
  Value VVar2;
  Value in_stack_000000a0;
  TDigest *in_stack_000000a8;
  TDigest *in_stack_00000110;
  
  bVar1 = haveUnprocessed((TDigest *)0x9e22dd);
  if ((bVar1) || (bVar1 = isDirty(in_XMM0_Qa), bVar1)) {
    process(in_stack_00000110);
  }
  VVar2 = quantileProcessed(in_stack_000000a8,in_stack_000000a0);
  return VVar2;
}

Assistant:

Value quantile(Value q) {
		if (haveUnprocessed() || isDirty()) {
			process();
		}
		return quantileProcessed(q);
	}